

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  stbi__zhuffman *z;
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  stbi_uc sVar9;
  byte *pbVar10;
  byte *pbVar11;
  int iVar12;
  stbi_uc *psVar13;
  char *pcVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  long in_FS_OFFSET;
  stbi_uc local_a08 [31];
  byte bStack_9e9;
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header == 0) {
LAB_0012e7de:
    a->num_bits = 0;
    a->code_buffer = 0;
    z = &a->z_length;
    do {
      uVar2 = stbi__zreceive(a,1);
      uVar3 = stbi__zreceive(a,2);
      if (uVar3 == 0) {
        uVar3 = a->num_bits;
        if ((uVar3 & 7) != 0) {
          stbi__zreceive(a,uVar3 & 7);
          uVar3 = a->num_bits;
        }
        uVar17 = 0;
        while (0 < (int)uVar3) {
          uVar4 = a->code_buffer;
          *(char *)((long)z_codelength.fast + uVar17) = (char)uVar4;
          uVar17 = uVar17 + 1;
          a->code_buffer = uVar4 >> 8;
          uVar3 = uVar3 - 8;
          a->num_bits = uVar3;
        }
        if ((int)uVar3 < 0) {
LAB_0012ecb8:
          pcVar14 = "zlib corrupt";
LAB_0012ec89:
          *(char **)(in_FS_OFFSET + -0x10) = pcVar14;
          goto LAB_0012eca4;
        }
        for (; uVar17 < 4; uVar17 = uVar17 + 1) {
          psVar13 = a->zbuffer;
          if (psVar13 < a->zbuffer_end) {
            a->zbuffer = psVar13 + 1;
            sVar9 = *psVar13;
          }
          else {
            sVar9 = '\0';
          }
          *(stbi_uc *)((long)z_codelength.fast + uVar17) = sVar9;
        }
        if ((z_codelength.fast[1] ^ z_codelength.fast[0]) != 0xffff) goto LAB_0012ecb8;
        psVar13 = a->zbuffer;
        uVar17 = (ulong)z_codelength.fast[0];
        if (a->zbuffer_end < psVar13 + uVar17) {
          pcVar14 = "read past buffer";
          goto LAB_0012ec89;
        }
        pcVar14 = a->zout;
        if (a->zout_end < pcVar14 + uVar17) {
          iVar7 = stbi__zexpand(a,pcVar14,(uint)z_codelength.fast[0]);
          if (iVar7 == 0) goto LAB_0012eca4;
          psVar13 = a->zbuffer;
          pcVar14 = a->zout;
        }
        memcpy(pcVar14,psVar13,uVar17);
        a->zbuffer = a->zbuffer + uVar17;
        a->zout = a->zout + uVar17;
      }
      else {
        if (uVar3 == 1) {
          iVar7 = stbi__zbuild_huffman
                            (z,
                             "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                             ,0x120);
          if (iVar7 == 0) goto LAB_0012eca4;
          psVar13 = 
          "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
          ;
          iVar7 = 0x20;
        }
        else {
          if (uVar3 == 3) goto LAB_0012eca4;
          uVar4 = stbi__zreceive(a,5);
          uVar5 = stbi__zreceive(a,5);
          uVar6 = stbi__zreceive(a,4);
          local_a08[0] = '\0';
          local_a08[1] = '\0';
          local_a08[2] = '\0';
          local_a08[3] = '\0';
          local_a08[4] = '\0';
          local_a08[5] = '\0';
          local_a08[6] = '\0';
          local_a08[7] = '\0';
          local_a08[8] = '\0';
          local_a08[9] = '\0';
          local_a08[10] = '\0';
          local_a08[0xb] = '\0';
          local_a08[0xc] = '\0';
          local_a08[0xd] = '\0';
          local_a08[0xe] = '\0';
          local_a08[0xf] = '\0';
          local_a08[0x10] = '\0';
          local_a08[0x11] = '\0';
          local_a08[0x12] = '\0';
          uVar3 = uVar6 + 4;
          if ((int)(uVar6 + 4) < 1) {
            uVar3 = 0;
          }
          for (uVar17 = 0; uVar3 != uVar17; uVar17 = uVar17 + 1) {
            uVar6 = stbi__zreceive(a,3);
            local_a08[(byte)(&stbi__compute_huffman_codes_length_dezigzag)[uVar17]] = (stbi_uc)uVar6
            ;
          }
          iVar7 = stbi__zbuild_huffman(&z_codelength,local_a08,0x13);
          if (iVar7 == 0) goto LAB_0012eca4;
          iVar7 = uVar5 + 1;
          iVar12 = uVar5 + uVar4 + 0x102;
          iVar16 = 0;
          while( true ) {
            if (iVar12 <= iVar16) break;
            uVar3 = stbi__zhuffman_decode(a,&z_codelength);
            if (0x12 < uVar3) goto LAB_0012ec67;
            if (uVar3 < 0x10) {
              lencodes[iVar16] = (stbi_uc)uVar3;
              iVar16 = iVar16 + 1;
            }
            else {
              if (uVar3 == 0x11) {
                uVar3 = stbi__zreceive(a,3);
                iVar15 = uVar3 + 3;
LAB_0012e9a3:
                uVar3 = 0;
              }
              else {
                if (uVar3 != 0x10) {
                  uVar3 = stbi__zreceive(a,7);
                  iVar15 = uVar3 + 0xb;
                  goto LAB_0012e9a3;
                }
                uVar3 = stbi__zreceive(a,2);
                if (iVar16 == 0) goto LAB_0012ec67;
                iVar15 = uVar3 + 3;
                uVar3 = (uint)lencodes[(long)iVar16 + -1];
              }
              if (iVar12 - iVar16 < iVar15) goto LAB_0012ec67;
              memset(lencodes + iVar16,uVar3,(long)iVar15);
              iVar16 = iVar16 + iVar15;
            }
          }
          if (iVar12 != iVar16) {
LAB_0012ec67:
            pcVar14 = "bad codelengths";
            goto LAB_0012ec89;
          }
          iVar16 = stbi__zbuild_huffman(z,lencodes,uVar4 + 0x101);
          if (iVar16 == 0) goto LAB_0012eca4;
          psVar13 = lencodes + (int)(uVar4 + 0x101);
        }
        iVar7 = stbi__zbuild_huffman(&a->z_distance,psVar13,iVar7);
        if (iVar7 == 0) goto LAB_0012eca4;
        pcVar14 = a->zout;
        while( true ) {
          while (iVar7 = stbi__zhuffman_decode(a,z), iVar7 < 0x100) {
            if (iVar7 < 0) goto LAB_0012ec70;
            if (a->zout_end <= pcVar14) {
              iVar16 = stbi__zexpand(a,pcVar14,1);
              if (iVar16 == 0) goto LAB_0012eca4;
              pcVar14 = a->zout;
            }
            *pcVar14 = (char)iVar7;
            pcVar14 = pcVar14 + 1;
          }
          if (iVar7 == 0x100) break;
          uVar17 = (ulong)(iVar7 - 0x101);
          uVar3 = stbi__zlength_base[uVar17];
          if (0xffffffffffffffeb < uVar17 - 0x1c) {
            uVar4 = stbi__zreceive(a,stbi__zlength_extra[uVar17]);
            uVar3 = uVar3 + uVar4;
          }
          uVar4 = stbi__zhuffman_decode(a,&a->z_distance);
          if ((int)uVar4 < 0) {
LAB_0012ec70:
            pcVar14 = "bad huffman code";
            goto LAB_0012ec89;
          }
          uVar17 = (ulong)uVar4;
          iVar7 = stbi__zdist_base[uVar17];
          if (0xffffffffffffffe5 < uVar17 - 0x1e) {
            uVar4 = stbi__zreceive(a,stbi__zdist_extra[uVar17]);
            iVar7 = iVar7 + uVar4;
          }
          if ((long)pcVar14 - (long)a->zout_start < (long)iVar7) {
            pcVar14 = "bad dist";
            goto LAB_0012ec89;
          }
          if (a->zout_end < pcVar14 + (int)uVar3) {
            iVar16 = stbi__zexpand(a,pcVar14,uVar3);
            if (iVar16 == 0) goto LAB_0012eca4;
            pcVar14 = a->zout;
          }
          lVar8 = -(long)iVar7;
          if (iVar7 == 1) {
            if (uVar3 != 0) {
              memset(pcVar14,(uint)(byte)pcVar14[lVar8],(ulong)uVar3);
              pcVar14 = pcVar14 + (ulong)(uVar3 - 1) + 1;
            }
          }
          else {
            for (; uVar3 != 0; uVar3 = uVar3 - 1) {
              *pcVar14 = pcVar14[lVar8];
              pcVar14 = pcVar14 + 1;
            }
          }
        }
        a->zout = pcVar14;
      }
    } while (uVar2 == 0);
    iVar7 = 1;
  }
  else {
    pbVar10 = a->zbuffer;
    pbVar1 = a->zbuffer_end;
    uVar2 = 0;
    if (pbVar10 < pbVar1) {
      a->zbuffer = pbVar10 + 1;
      uVar3 = (uint)*pbVar10;
      pbVar10 = pbVar10 + 1;
    }
    else {
      uVar3 = 0;
    }
    pbVar11 = pbVar10;
    if (pbVar10 < pbVar1) {
      pbVar11 = pbVar10 + 1;
      a->zbuffer = pbVar11;
      uVar2 = (uint)*pbVar10;
    }
    pcVar14 = "bad zlib header";
    if ((pbVar11 < pbVar1) && ((short)((uVar3 << 8 | uVar2) % 0x1f) == 0)) {
      if ((uVar2 & 0x20) == 0) {
        if ((uVar3 & 0xf) == 8) goto LAB_0012e7de;
        pcVar14 = "bad compression";
      }
      else {
        pcVar14 = "no preset dict";
      }
    }
    *(char **)(in_FS_OFFSET + -0x10) = pcVar14;
LAB_0012eca4:
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}